

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mounts.cpp
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::Sys::Mounts::enable
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Mounts *this,SecretMount *path,Parameters *parameters,
          Parameters *options,Parameters *config)

{
  Client *client;
  string local_98;
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  Url local_58;
  Parameters *local_38;
  Parameters *config_local;
  Parameters *options_local;
  Parameters *parameters_local;
  SecretMount *path_local;
  Mounts *this_local;
  
  client = *(Client **)this;
  local_38 = config;
  config_local = options;
  options_local = parameters;
  parameters_local = (Parameters *)path;
  path_local = (SecretMount *)this;
  this_local = (Mounts *)__return_storage_ptr__;
  Vault::operator+(&local_98,"mounts/",path);
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Tiny(&local_78,&local_98);
  getUrl(&local_58,this,&local_78);
  HttpConsumer::post(__return_storage_ptr__,client,&local_58,options_local,config_local,local_38);
  Tiny<Vault::UrlDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&local_58);
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> Vault::Sys::Mounts::enable(
    const SecretMount &path, const Parameters &parameters,
    const Parameters &options, const Parameters &config) const {
  return HttpConsumer::post(client_, getUrl(Path{"mounts/" + path}), parameters,
                            options, config);
}